

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Surface.h
# Opt level: O1

vector<anurbs::Interval,_std::allocator<anurbs::Interval>_> * __thiscall
anurbs::Surface<3L,_anurbs::Ref<anurbs::NurbsSurfaceGeometry<3L>_>_>::spans_v
          (vector<anurbs::Interval,_std::allocator<anurbs::Interval>_> *__return_storage_ptr__,
          Surface<3L,_anurbs::Ref<anurbs::NurbsSurfaceGeometry<3L>_>_> *this)

{
  undefined8 uVar1;
  undefined8 uVar2;
  element_type *peVar3;
  element_type *peVar4;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var5;
  long lVar6;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var7;
  pointer pIVar8;
  int iVar9;
  undefined4 extraout_var;
  Index IVar10;
  undefined4 extraout_var_00;
  Index IVar11;
  long lVar12;
  Index IVar13;
  double value;
  undefined4 in_XMM1_Da;
  undefined4 in_XMM1_Db;
  vector<anurbs::Interval,_std::allocator<anurbs::Interval>_> *result;
  Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_> local_48;
  
  peVar3 = (this->m_surface_geometry).m_entry.
           super___shared_ptr<anurbs::Entry<anurbs::NurbsSurfaceGeometry<3L>_>,_(__gnu_cxx::_Lock_policy)2>
           ._M_ptr;
  peVar4 = (peVar3->m_data).
           super___shared_ptr<anurbs::NurbsSurfaceGeometry<3L>,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  p_Var5 = (peVar3->m_data).
           super___shared_ptr<anurbs::NurbsSurfaceGeometry<3L>,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi;
  if (p_Var5 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var5->_M_use_count = p_Var5->_M_use_count + 1;
      UNLOCK();
    }
    else {
      p_Var5->_M_use_count = p_Var5->_M_use_count + 1;
    }
  }
  lVar12 = *(long *)&(peVar4->m_knots_v).
                     super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage;
  lVar6 = (peVar4->m_knots_v).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
          m_storage.m_rows;
  if (lVar6 < 0 && lVar12 != 0) {
    __assert_fail("(dataPtr == 0) || ( rows >= 0 && (RowsAtCompileTime == Dynamic || RowsAtCompileTime == rows) && cols >= 0 && (ColsAtCompileTime == Dynamic || ColsAtCompileTime == cols))"
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/oberbichler[P]ANurbs/external_libraries/Eigen/src/Core/MapBase.h"
                  ,0xb0,
                  "Eigen::MapBase<Eigen::Ref<Eigen::Matrix<double, -1, 1>>, 0>::MapBase(PointerType, Index, Index) [Derived = Eigen::Ref<Eigen::Matrix<double, -1, 1>>, Level = 0]"
                 );
  }
  if (p_Var5 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var5);
  }
  iVar9 = (*(this->super_SurfaceBase<3L>)._vptr_SurfaceBase[3])(this);
  (*(this->super_SurfaceBase<3L>)._vptr_SurfaceBase[5])(this);
  local_48.
  super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>_>.
  _0_8_ = lVar12;
  local_48.
  super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>_>.
  _8_8_ = lVar6;
  IVar10 = Nurbs::upper_bound<Eigen::Ref<Eigen::Matrix<double,_1,1,0,_1,1>,0,Eigen::InnerStride<1>>>
                     (&local_48,CONCAT44(extraout_var,iVar9),lVar6 - CONCAT44(extraout_var,iVar9),
                      value);
  iVar9 = (*(this->super_SurfaceBase<3L>)._vptr_SurfaceBase[3])(this);
  (*(this->super_SurfaceBase<3L>)._vptr_SurfaceBase[5])(this);
  local_48.
  super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>_>.
  _0_8_ = lVar12;
  local_48.
  super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>_>.
  _8_8_ = lVar6;
  IVar11 = Nurbs::lower_bound<Eigen::Ref<Eigen::Matrix<double,_1,1,0,_1,1>,0,Eigen::InnerStride<1>>>
                     (&local_48,CONCAT44(extraout_var_00,iVar9),
                      lVar6 - CONCAT44(extraout_var_00,iVar9),
                      (double)CONCAT44(in_XMM1_Db,in_XMM1_Da));
  std::vector<anurbs::Interval,_std::allocator<anurbs::Interval>_>::vector
            (__return_storage_ptr__,(IVar11 - IVar10) + 1,(allocator_type *)&local_48);
  if (-1 < IVar11 - IVar10) {
    lVar12 = 8;
    IVar13 = IVar10;
    do {
      peVar3 = (this->m_surface_geometry).m_entry.
               super___shared_ptr<anurbs::Entry<anurbs::NurbsSurfaceGeometry<3L>_>,_(__gnu_cxx::_Lock_policy)2>
               ._M_ptr;
      p_Var5 = (this->m_surface_geometry).m_entry.
               super___shared_ptr<anurbs::Entry<anurbs::NurbsSurfaceGeometry<3L>_>,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi;
      if (p_Var5 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          p_Var5->_M_use_count = p_Var5->_M_use_count + 1;
          UNLOCK();
        }
        else {
          p_Var5->_M_use_count = p_Var5->_M_use_count + 1;
        }
      }
      peVar4 = (peVar3->m_data).
               super___shared_ptr<anurbs::NurbsSurfaceGeometry<3L>,_(__gnu_cxx::_Lock_policy)2>.
               _M_ptr;
      p_Var7 = (peVar3->m_data).
               super___shared_ptr<anurbs::NurbsSurfaceGeometry<3L>,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi;
      if (p_Var7 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          p_Var7->_M_use_count = p_Var7->_M_use_count + 1;
          UNLOCK();
        }
        else {
          p_Var7->_M_use_count = p_Var7->_M_use_count + 1;
        }
      }
      if ((IVar13 + -1 < 0) ||
         ((peVar4->m_knots_v).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
          m_storage.m_rows <= IVar13 + -1)) {
LAB_002cd35b:
        __assert_fail("index >= 0 && index < size()",
                      "/workspace/llm4binary/github/license_c_cmakelists/oberbichler[P]ANurbs/external_libraries/Eigen/src/Core/DenseCoeffsBase.h"
                      ,0x198,
                      "Scalar &Eigen::DenseCoeffsBase<Eigen::Matrix<double, -1, 1>, 1>::operator[](Index) [Derived = Eigen::Matrix<double, -1, 1>, Level = 1]"
                     );
      }
      uVar1 = *(undefined8 *)
               (*(long *)&(peVar4->m_knots_v).
                          super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage +
                -8 + IVar13 * 8);
      if (p_Var7 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var7);
      }
      if (p_Var5 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var5);
      }
      peVar3 = (this->m_surface_geometry).m_entry.
               super___shared_ptr<anurbs::Entry<anurbs::NurbsSurfaceGeometry<3L>_>,_(__gnu_cxx::_Lock_policy)2>
               ._M_ptr;
      p_Var5 = (this->m_surface_geometry).m_entry.
               super___shared_ptr<anurbs::Entry<anurbs::NurbsSurfaceGeometry<3L>_>,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi;
      if (p_Var5 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          p_Var5->_M_use_count = p_Var5->_M_use_count + 1;
          UNLOCK();
        }
        else {
          p_Var5->_M_use_count = p_Var5->_M_use_count + 1;
        }
      }
      peVar4 = (peVar3->m_data).
               super___shared_ptr<anurbs::NurbsSurfaceGeometry<3L>,_(__gnu_cxx::_Lock_policy)2>.
               _M_ptr;
      p_Var7 = (peVar3->m_data).
               super___shared_ptr<anurbs::NurbsSurfaceGeometry<3L>,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi;
      if (p_Var7 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          p_Var7->_M_use_count = p_Var7->_M_use_count + 1;
          UNLOCK();
        }
        else {
          p_Var7->_M_use_count = p_Var7->_M_use_count + 1;
        }
      }
      if ((IVar10 < 0) ||
         ((peVar4->m_knots_v).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
          m_storage.m_rows <= IVar13)) goto LAB_002cd35b;
      uVar2 = *(undefined8 *)
               (*(long *)&(peVar4->m_knots_v).
                          super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage +
               IVar13 * 8);
      if (p_Var7 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var7);
      }
      if (p_Var5 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var5);
      }
      pIVar8 = (__return_storage_ptr__->
               super__Vector_base<anurbs::Interval,_std::allocator<anurbs::Interval>_>)._M_impl.
               super__Vector_impl_data._M_start;
      *(undefined8 *)((long)pIVar8 + lVar12 + -8) = uVar1;
      *(undefined8 *)((long)&pIVar8->m_t0 + lVar12) = uVar2;
      IVar13 = IVar13 + 1;
      lVar12 = lVar12 + 0x10;
    } while (IVar11 + 1 != IVar13);
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<Interval> spans_v() const override
    {
        auto knots = m_surface_geometry->knots_v();

        Index first_span = Nurbs::upper_span(degree_v(), knots, domain_v().t0());
        Index last_span = Nurbs::lower_span(degree_v(), knots, domain_v().t1());

        Index nb_spans = last_span - first_span + 1;

        std::vector<Interval> result(nb_spans);

        for (Index i = 0; i < nb_spans; i++) {
            double v0 = surface_geometry()->knot_v(first_span + i);
            double v1 = surface_geometry()->knot_v(first_span + i + 1);

            result[i] = Interval(v0, v1);
        }

        return result;
    }